

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

uint64_t __thiscall RPCHelpMan::ArgValue<unsigned_long>(RPCHelpMan *this,size_t i)

{
  UniValue **ppUVar1;
  unsigned_long uVar2;
  long in_FS_OFFSET;
  UniValue *maybe_arg;
  UniValue *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = DetailMaybeArg(CheckRequiredOrDefault,&this->m_args,this->m_req,i);
  ppUVar1 = inline_check_non_fatal<UniValue_const*&>
                      (&local_10,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/util.cpp"
                       ,0x2e1,"ArgValue","maybe_arg");
  uVar2 = ::UniValue::getInt<unsigned_long>(*ppUVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool RPCHelpMan::IsValidNumArgs(size_t num_args) const
{
    size_t num_required_args = 0;
    for (size_t n = m_args.size(); n > 0; --n) {
        if (!m_args.at(n - 1).IsOptional()) {
            num_required_args = n;
            break;
        }
    }
    return num_required_args <= num_args && num_args <= m_args.size();
}